

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

void __thiscall CVmObjList::CVmObjList(CVmObjList *this,char *lst)

{
  size_t sVar1;
  void *in_RSI;
  CVmObjCollection *in_RDI;
  size_t cnt;
  size_t in_stack_ffffffffffffffd8;
  char *__dest;
  CVmObjList *in_stack_ffffffffffffffe0;
  
  CVmObjCollection::CVmObjCollection(in_RDI);
  (in_RDI->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_0042ac18;
  sVar1 = vmb_get_len((char *)0x36ee5a);
  alloc_list(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  __dest = (in_RDI->super_CVmObject).ext_;
  sVar1 = calc_alloc(sVar1);
  memcpy(__dest,in_RSI,sVar1);
  return;
}

Assistant:

CVmObjList::CVmObjList(VMG_ const char *lst)
{
    /* get the element count from the original list */
    size_t cnt = vmb_get_len(lst);

    /* allocate space */
    alloc_list(vmg_ cnt);

    /* copy the list's contents */
    memcpy(ext_, lst, calc_alloc(cnt));
}